

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseDim
          (SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *tol)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  int iVar4;
  undefined8 *puVar5;
  DataKey DVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  uint *puVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  cpp_dec_float<200U,_int,_void> *pcVar12;
  steeppr *psVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  long lVar16;
  long lVar17;
  byte bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  DataKey local_2e0;
  ulong local_2d8;
  cpp_dec_float<200U,_int,_void> local_2b0;
  cpp_dec_float<200U,_int,_void> local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  steeppr local_b0 [112];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  bVar18 = 0;
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  lVar17 = (long)(pSVar1->thecovectors->set).thenum;
  if (lVar17 < 1) {
    DVar6.info = 0;
    DVar6.idx = -1;
  }
  else {
    pnVar2 = (pSVar1->theCoTest).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar3 = (pSVar1->coWeights).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_2d8 = 0xffffffff;
    lVar16 = 0;
    lVar8 = 0x78;
    local_2e0.info = 0;
    local_2e0.idx = 0;
    do {
      puVar5 = (undefined8 *)((long)&(pnVar2->m_backend).data + lVar8);
      puVar9 = (uint *)(puVar5 + -0xf);
      pcVar12 = &local_2b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar12->data)._M_elems[0] = *puVar9;
        puVar9 = puVar9 + (ulong)bVar18 * -2 + 1;
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
      }
      local_2b0.exp = *(int *)(puVar5 + -1);
      local_2b0.neg = *(bool *)((long)puVar5 + -4);
      local_2b0._120_8_ = *puVar5;
      pnVar11 = tol;
      pcVar12 = &local_230;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pcVar12->data)._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
        pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
        pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
      }
      local_230.exp = (tol->m_backend).exp;
      local_230.neg = (tol->m_backend).neg;
      local_230.fpclass = (tol->m_backend).fpclass;
      local_230.prec_elem = (tol->m_backend).prec_elem;
      if (local_230.data._M_elems[0] != 0 || local_230.fpclass != cpp_dec_float_finite) {
        local_230.neg = (bool)(local_230.neg ^ 1);
      }
      if ((local_2b0.fpclass != cpp_dec_float_NaN && local_230.fpclass != cpp_dec_float_NaN) &&
         (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&local_2b0,&local_230), iVar4 < 0)) {
        pcVar12 = &local_2b0;
        psVar13 = local_b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(uint *)psVar13 = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
          psVar13 = psVar13 + (ulong)bVar18 * -8 + 4;
        }
        local_40 = local_2b0.exp;
        local_3c = local_2b0.neg;
        local_38 = local_2b0.fpclass;
        iStack_34 = local_2b0.prec_elem;
        puVar9 = (uint *)((long)&(pnVar3->m_backend).data + lVar8 + -0x78);
        puVar10 = puVar9;
        pnVar11 = &local_130;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar11->m_backend).data._M_elems[0] = *puVar10;
          puVar10 = puVar10 + (ulong)bVar18 * -2 + 1;
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_130.m_backend.exp = puVar9[0x1c];
        local_130.m_backend.neg = SUB41(puVar9[0x1d],0);
        local_130.m_backend.fpclass = puVar9[0x1e];
        local_130.m_backend.prec_elem = puVar9[0x1f];
        pnVar11 = tol;
        pnVar14 = &local_1b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar14->m_backend).data._M_elems[0] = (pnVar11->m_backend).data._M_elems[0];
          pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar18 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = (tol->m_backend).exp;
        local_1b0.m_backend.neg = (tol->m_backend).neg;
        local_1b0.m_backend.fpclass = (tol->m_backend).fpclass;
        local_1b0.m_backend.prec_elem = (tol->m_backend).prec_elem;
        steeppr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_230,local_b0,&local_130,&local_1b0,&local_130);
        pcVar12 = &local_230;
        pcVar15 = &local_2b0;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pcVar15->data)._M_elems[0] = (pcVar12->data)._M_elems[0];
          pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
          pcVar15 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar15 + (ulong)bVar18 * -8 + 4);
        }
        local_2b0.exp = local_230.exp;
        local_2b0.neg = local_230.neg;
        local_2b0.fpclass = local_230.fpclass;
        local_2b0.prec_elem = local_230.prec_elem;
        if (((local_230.fpclass != cpp_dec_float_NaN) &&
            ((best->m_backend).fpclass != cpp_dec_float_NaN)) &&
           (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                              (&local_2b0,&best->m_backend), 0 < iVar4)) {
          pcVar12 = &local_2b0;
          pnVar11 = best;
          for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
            (pnVar11->m_backend).data._M_elems[0] = (pcVar12->data)._M_elems[0];
            pcVar12 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar12 + (ulong)bVar18 * -8 + 4);
            pnVar11 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar11 + ((ulong)bVar18 * -2 + 1) * 4);
          }
          (best->m_backend).exp = local_2b0.exp;
          (best->m_backend).neg = local_2b0.neg;
          (best->m_backend).fpclass = local_2b0.fpclass;
          (best->m_backend).prec_elem = local_2b0.prec_elem;
          local_2e0 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ::coId((this->
                                      super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).thesolver,(int)lVar16);
          local_2d8 = (ulong)local_2e0 >> 0x20;
        }
      }
      lVar16 = lVar16 + 1;
      lVar8 = lVar8 + 0x80;
    } while (lVar17 != lVar16);
    DVar6 = (DataKey)((ulong)local_2e0 & 0xffffffff | local_2d8 << 0x20);
  }
  return (SPxId)DVar6;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterDenseDim(R& best, R tol)
{
   SPxId enterId;
   const R* coTest        = this->thesolver->coTest().get_const_ptr();
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();

   R x;

   for(int i = 0, end = this->thesolver->dim(); i < end; ++i)
   {
      x = coTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            enterId = this->thesolver->coId(i);
         }
      }
   }

   return enterId;
}